

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O0

void ncnn::draw_line_yuv420sp
               (uchar *yuv420sp,int w,int h,int x0,int y0,int x1,int y1,uint color,int thickness)

{
  int *piVar1;
  int in_EDX;
  undefined1 in_stack_00000011;
  undefined1 in_stack_00000012;
  int in_stack_00000018;
  int thickness_uv;
  uchar *UV;
  uchar *Y;
  uchar *pen_color_uv;
  uchar *pen_color_y;
  uint v_uv;
  uint v_y;
  uchar *pen_color;
  int in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int h_00;
  int in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int y1_00;
  uint color_00;
  int in_stack_ffffffffffffffd0;
  undefined1 local_2c [4];
  undefined1 *local_28;
  int local_10;
  
  local_28 = &stack0x00000010;
  color_00 = (uint)local_2c;
  y1_00 = (int)&stack0xffffffffffffffd0;
  local_10 = in_EDX;
  draw_line_c1((uchar *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
               in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,y1_00,color_00,
               in_stack_ffffffffffffffd0);
  if (in_stack_00000018 == -1) {
    h_00 = -1;
  }
  else {
    in_stack_ffffffffffffffa8 = in_stack_00000018 / 2;
    in_stack_ffffffffffffffa4 = 1;
    piVar1 = std::max<int>((int *)&stack0xffffffffffffffa8,(int *)&stack0xffffffffffffffa4);
    h_00 = *piVar1;
  }
  draw_line_c2((uchar *)CONCAT44(h_00,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa4,h_00,
               local_10 / 2,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,y1_00,color_00,
               in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void draw_line_yuv420sp(unsigned char* yuv420sp, int w, int h, int x0, int y0, int x1, int y1, unsigned int color, int thickness)
{
    // assert w % 2 == 0
    // assert h % 2 == 0
    // assert x0 % 2 == 0
    // assert y0 % 2 == 0
    // assert x1 % 2 == 0
    // assert y1 % 2 == 0
    // assert thickness % 2 == 0

    const unsigned char* pen_color = (const unsigned char*)&color;

    unsigned int v_y;
    unsigned int v_uv;
    unsigned char* pen_color_y = (unsigned char*)&v_y;
    unsigned char* pen_color_uv = (unsigned char*)&v_uv;
    pen_color_y[0] = pen_color[0];
    pen_color_uv[0] = pen_color[1];
    pen_color_uv[1] = pen_color[2];

    unsigned char* Y = yuv420sp;
    draw_line_c1(Y, w, h, x0, y0, x1, y1, v_y, thickness);

    unsigned char* UV = yuv420sp + w * h;
    int thickness_uv = thickness == -1 ? thickness : std::max(thickness / 2, 1);
    draw_line_c2(UV, w / 2, h / 2, x0 / 2, y0 / 2, x1 / 2, y1 / 2, v_uv, thickness_uv);
}